

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseFile(X3DImporter *this,string *pFile,IOSystem *pIOHandler)

{
  FIReader *pFVar1;
  FIReader *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  runtime_error *prVar4;
  long *plVar5;
  IIrrXMLReader<char,_irr::io::IXMLBase> *pIVar6;
  _Head_base<0UL,_Assimp::FIReader_*,_false> _Var7;
  _Head_base<0UL,_Assimp::FIReader_*,_false> local_70;
  long local_68;
  IIrrXMLReader<char,_irr::io::IXMLBase> local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *stream;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (this->mReader)._M_t.
  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
  super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = (FIReader *)0x0;
  local_70._M_head_impl = (FIReader *)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_70._M_head_impl);
  stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  if (&(local_70._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase> != &local_60) {
    operator_delete(local_70._M_head_impl);
  }
  if (stream == (IOStream *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open X3D file ",pFile);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_head_impl = (FIReader *)*plVar5;
    pIVar6 = (IIrrXMLReader<char,_irr::io::IXMLBase> *)(plVar5 + 2);
    if ((IIrrXMLReader<char,_irr::io::IXMLBase> *)local_70._M_head_impl == pIVar6) {
      local_60._vptr_IIrrXMLReader = pIVar6->_vptr_IIrrXMLReader;
      lStack_58 = plVar5[3];
      local_70._M_head_impl = (FIReader *)&local_60;
    }
    else {
      local_60._vptr_IIrrXMLReader = pIVar6->_vptr_IIrrXMLReader;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)pIVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  FIReader::create((FIReader *)&local_70,stream);
  _Var7._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (FIReader *)0x0;
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (this->mReader)._M_t.
  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
  super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (pFVar2 != (FIReader *)0x0) {
    (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[1])();
    if (local_70._M_head_impl != (FIReader *)0x0) {
      (*((local_70._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader
        [1])();
    }
    _Var7._M_head_impl =
         (this->mReader)._M_t.
         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
         super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  }
  if (&(_Var7._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase> !=
      (IIrrXMLReader<char,_irr::io::IXMLBase> *)0x0) {
    local_70._M_head_impl = (FIReader *)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"urn:web3d:x3d:fi-vocabulary-3.2","");
    (*((_Var7._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x15]
    )(_Var7._M_head_impl,&local_70,X3D_vocabulary_3_2);
    if (&(local_70._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase> != &local_60) {
      operator_delete(local_70._M_head_impl);
    }
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    local_70._M_head_impl = (FIReader *)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"urn:web3d:x3d:fi-vocabulary-3.3","");
    (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x15])
              (pFVar2,&local_70,X3D_vocabulary_3_3);
    if (&(local_70._M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase> != &local_60) {
      operator_delete(local_70._M_head_impl);
    }
    ParseNode_Root(this);
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    (this->mReader)._M_t.
    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
    super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = pFVar1;
    if (pFVar2 != (FIReader *)0x0) {
      (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[1])();
    }
    (*stream->_vptr_IOStream[1])(stream);
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to create XML reader for file",pFile);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_head_impl = (FIReader *)*plVar5;
  pIVar6 = (IIrrXMLReader<char,_irr::io::IXMLBase> *)(plVar5 + 2);
  if ((IIrrXMLReader<char,_irr::io::IXMLBase> *)local_70._M_head_impl == pIVar6) {
    local_60._vptr_IIrrXMLReader = pIVar6->_vptr_IIrrXMLReader;
    lStack_58 = plVar5[3];
    local_70._M_head_impl = (FIReader *)&local_60;
  }
  else {
    local_60._vptr_IIrrXMLReader = pIVar6->_vptr_IIrrXMLReader;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)pIVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)&local_70);
  *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::ParseFile(const std::string& pFile, IOSystem* pIOHandler)
{
    std::unique_ptr<FIReader> OldReader = std::move(mReader);// store current XMLreader.
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

	// Check whether we can read from the file
    if ( file.get() == nullptr )
    {
        throw DeadlyImportError( "Failed to open X3D file " + pFile + "." );
    }
	mReader = FIReader::create(file.get());
    if ( !mReader )
    {
        throw DeadlyImportError( "Failed to create XML reader for file" + pFile + "." );
    }
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.2", &X3D_vocabulary_3_2);
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.3", &X3D_vocabulary_3_3);
	// start reading
	ParseNode_Root();

	// restore old XMLreader
	mReader = std::move(OldReader);
}